

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacintoshIMG.cpp
# Opt level: O2

shared_ptr<Storage::Disk::Track> __thiscall
Storage::Disk::MacintoshIMG::get_track_at_position(MacintoshIMG *this,Address address)

{
  byte bVar1;
  undefined8 uVar2;
  SectorSpan SVar3;
  long lVar4;
  int iVar5;
  undefined8 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int track;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  bool side_two;
  shared_ptr<Storage::Disk::Track> sVar11;
  byte local_328 [16];
  long local_318;
  MacintoshIMG *local_310;
  undefined8 local_308;
  ulong local_300;
  PCMSegment segment;
  PCMSegment local_2a0;
  uint8_t sector_plus_tags [524];
  
  std::mutex::lock((mutex *)&((pthread_mutex_t *)((long)address + 0x130))->__data);
  if (*(uint *)((long)address + 0xf0) < 2) {
    track = (int)((long)in_RDX >> 0x22);
    SVar3 = Encodings::AppleGCR::Macintosh::sectors_in_track(track);
    uVar9 = SVar3.length;
    lVar4 = (ulong)((int)in_RDX * uVar9 +
                   (((*(byte *)((long)address + 0xf4) >> 5 & 1) != 0) + 1) * SVar3.start) << 0x20;
    uVar10 = lVar4 >> 0x17;
    local_318 = *(long *)((long)address + 0xf8);
    if (uVar10 < (ulong)(*(long *)((long)address + 0x100) - local_318)) {
      lVar8 = 0;
      if (*(long *)((long)address + 0x118) != *(long *)((long)address + 0x110)) {
        lVar8 = (lVar4 >> 0x20) * 0xc + *(long *)((long)address + 0x110);
      }
      segment.length_of_a_bit.length = 1;
      segment.length_of_a_bit.clock_rate = 1;
      segment.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      segment.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_offset = 0;
      segment.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      segment.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_finish.super__Bit_iterator_base._M_offset = 0;
      segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_end_of_storage = (_Bit_pointer)0x0;
      segment.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_start.super__Bit_iterator_base._M_offset = 0;
      local_308 = in_RDX;
      Encodings::AppleGCR::six_and_two_sync((PCMSegment *)sector_plus_tags,0x18);
      PCMSegment::operator+=(&segment,(PCMSegment *)sector_plus_tags);
      local_318 = local_318 + uVar10;
      PCMSegment::~PCMSegment((PCMSegment *)sector_plus_tags);
      local_328[8] = 0xff;
      local_328[9] = 0xff;
      local_328[10] = 0xff;
      local_328[0xb] = 0xff;
      local_328[0] = 0xff;
      local_328[1] = 0xff;
      local_328[2] = 0xff;
      local_328[3] = 0xff;
      local_328[4] = 0xff;
      local_328[5] = 0xff;
      local_328[6] = 0xff;
      local_328[7] = 0xff;
      bVar1 = *(byte *)((long)address + 0xf4);
      iVar5 = 0;
      uVar6 = 0;
      if (uVar9 != 0 && -1 < (long)SVar3) {
        uVar6 = uVar9;
      }
      for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
        for (; local_328[iVar5] != 0xff; iVar5 = (iVar5 + 1) % (int)uVar9) {
        }
        local_328[iVar5] = (byte)uVar7;
        iVar5 = (int)(iVar5 + (bVar1 & 0x1f)) % (int)uVar9;
      }
      local_310 = this;
      local_300 = (ulong)uVar6;
      for (uVar10 = 0; local_300 != uVar10; uVar10 = uVar10 + 1) {
        bVar1 = local_328[uVar10];
        if (lVar8 == 0) {
          sector_plus_tags._8_8_ = (ulong)(uint)sector_plus_tags._12_4_ << 0x20;
          sector_plus_tags[0] = '\0';
          sector_plus_tags[1] = '\0';
          sector_plus_tags[2] = '\0';
          sector_plus_tags[3] = '\0';
          sector_plus_tags[4] = '\0';
          sector_plus_tags[5] = '\0';
          sector_plus_tags[6] = '\0';
          sector_plus_tags[7] = '\0';
        }
        else {
          sector_plus_tags._8_4_ = *(undefined4 *)(lVar8 + 8 + (ulong)bVar1 * 0xc);
          sector_plus_tags._0_8_ = *(undefined8 *)(lVar8 + (ulong)bVar1 * 0xc);
        }
        side_two = (int)local_308 != 0;
        memcpy(sector_plus_tags + 0xc,(void *)((ulong)bVar1 * 0x200 + local_318),0x200);
        Encodings::AppleGCR::Macintosh::header
                  (&local_2a0,*(uint8_t *)((long)address + 0xf4),(uint8_t)track,bVar1,side_two);
        PCMSegment::operator+=(&segment,&local_2a0);
        PCMSegment::~PCMSegment(&local_2a0);
        Encodings::AppleGCR::six_and_two_sync(&local_2a0,7);
        PCMSegment::operator+=(&segment,&local_2a0);
        PCMSegment::~PCMSegment(&local_2a0);
        Encodings::AppleGCR::Macintosh::data(&local_2a0,bVar1,sector_plus_tags);
        PCMSegment::operator+=(&segment,&local_2a0);
        PCMSegment::~PCMSegment(&local_2a0);
        Encodings::AppleGCR::six_and_two_sync(&local_2a0,0x14);
        PCMSegment::operator+=(&segment,&local_2a0);
        PCMSegment::~PCMSegment(&local_2a0);
      }
      std::make_shared<Storage::Disk::PCMTrack,Storage::Disk::PCMSegment&>
                ((PCMSegment *)sector_plus_tags);
      uVar2 = sector_plus_tags._8_8_;
      this = local_310;
      sector_plus_tags[8] = '\0';
      sector_plus_tags[9] = '\0';
      sector_plus_tags[10] = '\0';
      sector_plus_tags[0xb] = '\0';
      sector_plus_tags[0xc] = '\0';
      sector_plus_tags[0xd] = '\0';
      sector_plus_tags[0xe] = '\0';
      sector_plus_tags[0xf] = '\0';
      (local_310->super_DiskImage)._vptr_DiskImage = (_func_int **)sector_plus_tags._0_8_;
      (local_310->file_).file_ = (FILE *)uVar2;
      sector_plus_tags[0] = '\0';
      sector_plus_tags[1] = '\0';
      sector_plus_tags[2] = '\0';
      sector_plus_tags[3] = '\0';
      sector_plus_tags[4] = '\0';
      sector_plus_tags[5] = '\0';
      sector_plus_tags[6] = '\0';
      sector_plus_tags[7] = '\0';
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(sector_plus_tags + 8));
      PCMSegment::~PCMSegment(&segment);
      goto LAB_003d93ea;
    }
  }
  (this->super_DiskImage)._vptr_DiskImage = (_func_int **)0x0;
  (this->file_).file_ = (FILE *)0x0;
LAB_003d93ea:
  pthread_mutex_unlock((pthread_mutex_t *)((long)address + 0x130));
  sVar11.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar11.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Storage::Disk::Track>)
         sVar11.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<::Storage::Disk::Track> MacintoshIMG::get_track_at_position(::Storage::Disk::Track::Address address) {
	/*
		The format_ byte has the following meanings:

		GCR:
			This byte appears on disk as the GCR format nibble in every sector tag.
			The low five bits are an interleave factor, either:

				'2' for 0 8 1 9 2 10 3 11 4 12 5 13 6 14 7 15; or
				'4' for 0 4 8 12 1 5 9 13 2 6 10 14 3 7 11 15.

			Bit 5 indicates double sided or not.

		MFM:
			The low five bits provide sector size as a multiple of 256 bytes.
			Bit 5 indicates double sided or not.
	*/

	std::lock_guard buffer_lock(buffer_mutex_);
	if(encoding_ == Encoding::GCR400 || encoding_ == Encoding::GCR800) {
		// Perform a GCR encoding.
		const auto included_sectors = Storage::Encodings::AppleGCR::Macintosh::sectors_in_track(address.position.as_int());
		const size_t start_sector = size_t(included_sectors.start * get_head_count() + included_sectors.length * address.head);

		if(start_sector*512 >= data_.size()) return nullptr;

		uint8_t *const sector = &data_[512 * start_sector];
		uint8_t *const tags = tags_.size() ? &tags_[12 * start_sector] : nullptr;

		Storage::Disk::PCMSegment segment;
		segment += Encodings::AppleGCR::six_and_two_sync(24);

		// Determine the sector ordering.
		uint8_t source_sectors[12] = {0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff};
		int destination = 0;
		for(int c = 0; c < included_sectors.length; ++c) {
			// Deal with collisions by finding the next non-colliding spot.
			while(source_sectors[destination] != 0xff) destination = (destination + 1) % included_sectors.length;
			source_sectors[destination] = uint8_t(c);
			destination = (destination + (format_ & 0x1f)) % included_sectors.length;
		}

		for(int c = 0; c < included_sectors.length; ++c) {
			const uint8_t sector_id = source_sectors[c];
			uint8_t sector_plus_tags[524];

			// Copy in the tags, if provided; otherwise generate them.
			if(tags) {
				memcpy(sector_plus_tags, &tags[sector_id * 12], 12);
			} else {
				// TODO: fill in tags properly.
				memset(sector_plus_tags, 0, 12);
			}

			// Copy in the sector body.
			memcpy(&sector_plus_tags[12], &sector[sector_id * 512], 512);

			// NB: sync lengths below are identical to those for
			// the Apple II, as I have no idea whatsoever what they
			// should be.

			segment += Encodings::AppleGCR::Macintosh::header(
				format_,
				uint8_t(address.position.as_int()),
				sector_id,
				!!address.head
			);
			segment += Encodings::AppleGCR::six_and_two_sync(7);
			segment += Encodings::AppleGCR::Macintosh::data(sector_id, sector_plus_tags);
			segment += Encodings::AppleGCR::six_and_two_sync(20);
		}

		// TODO: it seems some tracks are skewed respective to others; investigate further.

//		segment.rotate_right(3000);	// Just a test, yo.
		return std::make_shared<PCMTrack>(segment);
	}

	return nullptr;
}